

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void EnableOrDisableLogCategories(UniValue *cats,bool enable)

{
  long lVar1;
  string_view str;
  string_view str_00;
  size_t sVar2;
  undefined8 uVar3;
  byte in_SIL;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  bool success;
  uint i;
  string cat;
  UniValue *in_stack_ffffffffffffff28;
  UniValue *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  Logger *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar4;
  __sv_type in_stack_ffffffffffffff70;
  bool local_59;
  uint local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::get_array(in_stack_ffffffffffffff30);
  UniValue::operator=((UniValue *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                      in_stack_ffffffffffffff30);
  local_58 = 0;
  do {
    sVar2 = UniValue::size(in_stack_ffffffffffffff28);
    if (sVar2 <= local_58) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_01381f13:
      __stack_chk_fail();
    }
    UniValue::operator[]
              ((UniValue *)in_stack_ffffffffffffff40,
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    UniValue::get_str_abi_cxx11_(in_stack_ffffffffffffff30);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70._M_len,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if ((in_SIL & 1) == 0) {
      in_stack_ffffffffffffff40 = LogInstance();
      in_stack_ffffffffffffff70 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      str_00._M_str._0_7_ = in_stack_ffffffffffffff68;
      str_00._M_len = in_RDI;
      str_00._M_str._7_1_ = in_stack_ffffffffffffff6f;
      in_stack_ffffffffffffff3f =
           BCLog::Logger::DisableCategory
                     ((Logger *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),str_00
                     );
      local_59 = (bool)in_stack_ffffffffffffff3f;
    }
    else {
      LogInstance();
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      str._M_str._0_7_ = in_stack_ffffffffffffff68;
      str._M_len = in_RDI;
      str._M_str._7_1_ = in_stack_ffffffffffffff6f;
      in_stack_ffffffffffffff4f =
           BCLog::Logger::EnableCategory
                     ((Logger *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),str);
      local_59 = (bool)in_stack_ffffffffffffff4f;
    }
    if (local_59 == false) {
      uVar4 = 1;
      uVar3 = __cxa_allocate_exception(0x58);
      std::operator+(in_stack_ffffffffffffff70._M_str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff70._M_len);
      JSONRPCError(in_stack_ffffffffffffff70._M_str._4_4_,
                   (string *)CONCAT17(uVar4,in_stack_ffffffffffffff68));
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_01381f13;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff28);
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

static void EnableOrDisableLogCategories(UniValue cats, bool enable) {
    cats = cats.get_array();
    for (unsigned int i = 0; i < cats.size(); ++i) {
        std::string cat = cats[i].get_str();

        bool success;
        if (enable) {
            success = LogInstance().EnableCategory(cat);
        } else {
            success = LogInstance().DisableCategory(cat);
        }

        if (!success) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "unknown logging category " + cat);
        }
    }
}